

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_d_vector.h
# Opt level: O2

void __thiscall
draco::PointDVector<unsigned_int>::PointDVector
          (PointDVector<unsigned_int> *this,uint32_t n_items,uint32_t dimensionality)

{
  allocator_type local_9;
  
  this->n_items_ = n_items;
  this->dimensionality_ = dimensionality;
  this->item_size_bytes_ = dimensionality * 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->data_,(ulong)(n_items * dimensionality),&local_9);
  this->data0_ = (this->data_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  return;
}

Assistant:

PointDVector(const uint32_t n_items, const uint32_t dimensionality)
      : n_items_(n_items),
        dimensionality_(dimensionality),
        item_size_bytes_(dimensionality * sizeof(internal_t)),
        data_(n_items * dimensionality),
        data0_(data_.data()) {}